

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

bool __thiscall
Assimp::X3DImporter::FindNodeElement_FromRoot
          (X3DImporter *this,string *pID,EType pType,CX3DImporter_NodeElement **pElement)

{
  bool bVar1;
  __type _Var2;
  reference ppCVar3;
  _Self local_40;
  _Self local_38;
  iterator it;
  CX3DImporter_NodeElement **pElement_local;
  EType pType_local;
  string *pID_local;
  X3DImporter *this_local;
  
  it._M_node = (_List_node_base *)pElement;
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
       begin(&this->NodeElement_List);
  do {
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
         ::end(&this->NodeElement_List);
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) {
      return false;
    }
    ppCVar3 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_38);
    if ((*ppCVar3)->Type == pType) {
      ppCVar3 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_38);
      _Var2 = std::operator==(&(*ppCVar3)->ID,pID);
      if (_Var2) {
        if (it._M_node != (_List_node_base *)0x0) {
          ppCVar3 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_38);
          (it._M_node)->_M_next = (_List_node_base *)*ppCVar3;
        }
        return true;
      }
    }
    std::_List_iterator<CX3DImporter_NodeElement_*>::operator++(&local_38);
  } while( true );
}

Assistant:

bool X3DImporter::FindNodeElement_FromRoot(const std::string& pID, const CX3DImporter_NodeElement::EType pType, CX3DImporter_NodeElement** pElement)
{
	for(std::list<CX3DImporter_NodeElement*>::iterator it = NodeElement_List.begin(); it != NodeElement_List.end(); ++it)
	{
		if(((*it)->Type == pType) && ((*it)->ID == pID))
		{
			if(pElement != nullptr) *pElement = *it;

			return true;
		}
	}// for(std::list<CX3DImporter_NodeElement*>::iterator it = NodeElement_List.begin(); it != NodeElement_List.end(); it++)

	return false;
}